

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas3_d.cpp
# Opt level: O3

void dgemm(char transa,char transb,int m,int n,int k,double alpha,double *a,int lda,double *b,
          int ldb,double beta,double *c,int ldc)

{
  int iVar1;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  uint uVar6;
  undefined7 in_register_00000039;
  ulong uVar7;
  double *pdVar8;
  int i2;
  ulong uVar9;
  ulong uVar10;
  byte bVar11;
  double dVar12;
  
  bVar11 = transa & 0xdf;
  iVar1 = k;
  if (bVar11 == 0x4e) {
    iVar1 = m;
  }
  i2 = n;
  if ((transb & 0xdfU) == 0x4e) {
    i2 = k;
  }
  uVar6 = (int)CONCAT71(in_register_00000039,transa) - 0x43;
  if ((uVar6 < 0x32) && ((0x2080100020801U >> ((ulong)uVar6 & 0x3f) & 1) != 0)) {
    if (((int)transb - 0x43U < 0x32) &&
       ((0x2080100020801U >> ((ulong)((int)transb - 0x43U) & 0x3f) & 1) != 0)) {
      if (m < 0) {
        std::operator<<((ostream *)&std::cerr,"\n");
        std::operator<<((ostream *)&std::cerr,"DGEMM - Fatal error!\n");
        pcVar5 = "  Input M has an illegal value.\n";
      }
      else if (n < 0) {
        std::operator<<((ostream *)&std::cerr,"\n");
        std::operator<<((ostream *)&std::cerr,"DGEMM - Fatal error!\n");
        pcVar5 = "  Input N has an illegal value.\n";
      }
      else if (k < 0) {
        std::operator<<((ostream *)&std::cerr,"\n");
        std::operator<<((ostream *)&std::cerr,"DGEMM - Fatal error!\n");
        pcVar5 = "  Input K has an illegal value.\n";
      }
      else {
        iVar1 = i4_max(1,iVar1);
        if (lda < iVar1) {
          std::operator<<((ostream *)&std::cerr,"\n");
          std::operator<<((ostream *)&std::cerr,"DGEMM - Fatal error!\n");
          pcVar5 = "  Input LDA has an illegal value.\n";
        }
        else {
          iVar1 = i4_max(1,i2);
          if (ldb < iVar1) {
            std::operator<<((ostream *)&std::cerr,"\n");
            std::operator<<((ostream *)&std::cerr,"DGEMM - Fatal error!\n");
            pcVar5 = "  Input LDB has an illegal value.\n";
          }
          else {
            iVar1 = i4_max(1,m);
            if (iVar1 <= ldc) {
              if ((n != 0 && m != 0) && (((k != 0 && alpha != 0.0 || (beta != 1.0)) || (NAN(beta))))
                 ) {
                if ((alpha != 0.0) || (NAN(alpha))) {
                  uVar9 = (ulong)(uint)n;
                  if ((transb & 0xdfU) == 0x4e) {
                    if (bVar11 == 0x4e) {
                      uVar10 = (ulong)(uint)m;
                      uVar7 = 0;
                      pdVar8 = c;
                      do {
                        if ((beta != 0.0) || (NAN(beta))) {
                          if ((beta != 1.0) || (NAN(beta))) {
                            uVar3 = 0;
                            do {
                              pdVar8[uVar3] = pdVar8[uVar3] * beta;
                              uVar3 = uVar3 + 1;
                            } while (uVar10 != uVar3);
                          }
                        }
                        else {
                          memset(c + (int)uVar7 * ldc,0,uVar10 * 8);
                        }
                        if (k != 0) {
                          uVar3 = 0;
                          pdVar2 = a;
                          do {
                            dVar12 = b[uVar7 * (long)ldb + uVar3];
                            if ((dVar12 != 0.0) || (NAN(dVar12))) {
                              uVar4 = 0;
                              do {
                                pdVar8[uVar4] = pdVar2[uVar4] * dVar12 * alpha + pdVar8[uVar4];
                                uVar4 = uVar4 + 1;
                              } while (uVar10 != uVar4);
                            }
                            uVar3 = uVar3 + 1;
                            pdVar2 = pdVar2 + lda;
                          } while (uVar3 != (uint)k);
                        }
                        uVar7 = uVar7 + 1;
                        pdVar8 = pdVar8 + ldc;
                      } while (uVar7 != uVar9);
                    }
                    else {
                      uVar7 = 0;
                      do {
                        uVar10 = 0;
                        pdVar8 = a;
                        do {
                          if (k == 0) {
                            dVar12 = 0.0;
                          }
                          else {
                            dVar12 = 0.0;
                            uVar3 = 0;
                            do {
                              dVar12 = dVar12 + pdVar8[uVar3] * b[uVar3];
                              uVar3 = uVar3 + 1;
                            } while ((uint)k != uVar3);
                          }
                          if ((beta != 0.0) || (NAN(beta))) {
                            dVar12 = dVar12 * alpha + c[uVar7 * (long)ldc + uVar10] * beta;
                          }
                          else {
                            dVar12 = dVar12 * alpha;
                          }
                          c[uVar7 * (long)ldc + uVar10] = dVar12;
                          uVar10 = uVar10 + 1;
                          pdVar8 = pdVar8 + lda;
                        } while (uVar10 != (uint)m);
                        uVar7 = uVar7 + 1;
                        b = b + ldb;
                      } while (uVar7 != uVar9);
                    }
                  }
                  else if (bVar11 == 0x4e) {
                    uVar10 = (ulong)(uint)m;
                    uVar7 = 0;
                    pdVar8 = c;
                    do {
                      if ((beta != 0.0) || (NAN(beta))) {
                        if ((beta != 1.0) || (NAN(beta))) {
                          uVar3 = 0;
                          do {
                            pdVar8[uVar3] = pdVar8[uVar3] * beta;
                            uVar3 = uVar3 + 1;
                          } while (uVar10 != uVar3);
                        }
                      }
                      else {
                        memset(c + (int)uVar7 * ldc,0,uVar10 * 8);
                      }
                      if (k != 0) {
                        uVar3 = 0;
                        pdVar2 = a;
                        do {
                          dVar12 = b[uVar7 + uVar3 * (long)ldb];
                          if ((dVar12 != 0.0) || (NAN(dVar12))) {
                            uVar4 = 0;
                            do {
                              pdVar8[uVar4] = pdVar2[uVar4] * dVar12 * alpha + pdVar8[uVar4];
                              uVar4 = uVar4 + 1;
                            } while (uVar10 != uVar4);
                          }
                          uVar3 = uVar3 + 1;
                          pdVar2 = pdVar2 + lda;
                        } while (uVar3 != (uint)k);
                      }
                      uVar7 = uVar7 + 1;
                      pdVar8 = pdVar8 + ldc;
                    } while (uVar7 != uVar9);
                  }
                  else {
                    uVar7 = 0;
                    do {
                      uVar10 = 0;
                      pdVar8 = a;
                      do {
                        if (k == 0) {
                          dVar12 = 0.0;
                        }
                        else {
                          dVar12 = 0.0;
                          uVar3 = 0;
                          pdVar2 = b;
                          do {
                            dVar12 = dVar12 + pdVar8[uVar3] * *pdVar2;
                            uVar3 = uVar3 + 1;
                            pdVar2 = pdVar2 + ldb;
                          } while ((uint)k != uVar3);
                        }
                        if ((beta != 0.0) || (NAN(beta))) {
                          dVar12 = dVar12 * alpha + c[uVar7 * (long)ldc + uVar10] * beta;
                        }
                        else {
                          dVar12 = dVar12 * alpha;
                        }
                        c[uVar7 * (long)ldc + uVar10] = dVar12;
                        uVar10 = uVar10 + 1;
                        pdVar8 = pdVar8 + lda;
                      } while (uVar10 != (uint)m);
                      uVar7 = uVar7 + 1;
                      b = b + 1;
                    } while (uVar7 != uVar9);
                  }
                }
                else if ((beta != 0.0) || (NAN(beta))) {
                  uVar9 = 0;
                  do {
                    uVar7 = 0;
                    do {
                      c[uVar7] = c[uVar7] * beta;
                      uVar7 = uVar7 + 1;
                    } while ((uint)m != uVar7);
                    uVar9 = uVar9 + 1;
                    c = c + ldc;
                  } while (uVar9 != (uint)n);
                }
                else {
                  uVar9 = (ulong)(uint)n;
                  iVar1 = 0;
                  do {
                    memset(c + iVar1,0,(ulong)(uint)m << 3);
                    iVar1 = iVar1 + ldc;
                    uVar9 = uVar9 - 1;
                  } while (uVar9 != 0);
                }
              }
              return;
            }
            std::operator<<((ostream *)&std::cerr,"\n");
            std::operator<<((ostream *)&std::cerr,"DGEMM - Fatal error!\n");
            pcVar5 = "  Input LDC has an illegal value.\n";
          }
        }
      }
    }
    else {
      std::operator<<((ostream *)&std::cerr,"\n");
      std::operator<<((ostream *)&std::cerr,"DGEMM - Fatal error!\n");
      pcVar5 = "  Input TRANSB has an illegal value.\n";
    }
  }
  else {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"DGEMM - Fatal error!\n");
    pcVar5 = "  Input TRANSA has an illegal value.\n";
  }
  std::operator<<((ostream *)&std::cerr,pcVar5);
  exit(1);
}

Assistant:

void dgemm ( char transa, char transb, int m, int n, int k, 
  double alpha, double a[], int lda, double b[], int ldb, double beta, 
  double c[], int ldc )

//****************************************************************************80
//
//  Purpose:
//
//    DGEMM computes C = alpha * A * B and related operations.
//
//  Discussion:
//
//    DGEMM performs one of the matrix-matrix operations
//
//     C := alpha * op ( A ) * op ( B ) + beta * C,
//
//    where op ( X ) is one of
//
//      op ( X ) = X   or   op ( X ) = X',
//
//    ALPHA and BETA are scalars, and A, B and C are matrices, with op ( A )
//    an M by K matrix, op ( B ) a K by N matrix and C an N by N matrix.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    10 February 2014
//
//  Author:
//
//    Original FORTRAN77 version by Jack Dongarra.
//    C++ version by John Burkardt.
//
//  Parameters:
//
//    Input, char TRANSA, specifies the form of op( A ) to be used in
//    the matrix multiplication as follows:
//    'N' or 'n', op ( A ) = A.
//    'T' or 't', op ( A ) = A'.
//    'C' or 'c', op ( A ) = A'.
//
//    Input, char TRANSB, specifies the form of op ( B ) to be used in
//    the matrix multiplication as follows:
//    'N' or 'n', op ( B ) = B.
//    'T' or 't', op ( B ) = B'.
//    'C' or 'c', op ( B ) = B'.
//
//    Input, int M, the number of rows of the  matrix op ( A ) and of the  
//    matrix C.  0 <= M.
//
//    Input, int N, the number  of columns of the matrix op ( B ) and the 
//    number of columns of the matrix C.  0 <= N.
//
//    Input, int K, the number of columns of the matrix op ( A ) and the 
//    number of rows of the matrix op ( B ).  0 <= K.
//
//    Input, double ALPHA, the scalar multiplier 
//    for op ( A ) * op ( B ).
//
//    Input, double A(LDA,KA), where:
//    if TRANSA is 'N' or 'n', KA is equal to K, and the leading M by K
//    part of the array contains A;
//    if TRANSA is not 'N' or 'n', then KA is equal to M, and the leading
//    K by M part of the array must contain the matrix A.
//
//    Input, int LDA, the first dimension of A as declared in the calling 
//    routine.  When TRANSA = 'N' or 'n' then LDA must be at least max ( 1, M ), 
//    otherwise LDA must be at least max ( 1, K ).
//
//    Input, double B(LDB,KB), where:
//    if TRANSB is 'N' or 'n', kB is N, and the leading K by N 
//    part of the array contains B;
//    if TRANSB is not 'N' or 'n', then KB is equal to K, and the leading
//    N by K part of the array must contain the matrix B.
//
//    Input, int LDB, the first dimension of B as declared in the calling 
//    routine.  When TRANSB = 'N' or 'n' then LDB must be at least max ( 1, K ), 
//    otherwise LDB must be at least max ( 1, N ).
//
//    Input, double BETA, the scalar multiplier for C.
//
//    Input/output, double C[LDC*N].
//    On input, the leading M by N part of this array must contain the 
//    matrix C, except when BETA is 0.0, in which case C need not be set.
//    On output, the array C is overwritten by the M by N matrix
//    alpha * op ( A ) * op ( B ) + beta * C.
//
//    Input, int LDC, the first dimension of C as declared in the calling 
//    routine.  max ( 1, M ) <= LDC.
//
{
  int i;
//int info;
  int j;
  int l;
//int ncola;
  int nrowa;
  int nrowb;
  bool nota;
  bool notb;
  double temp;
//
//  Set NOTA and NOTB as true if A and B respectively are not
//  transposed and set NROWA, NCOLA and NROWB as the number of rows
//  and columns of A and the number of rows of B respectively.
//
  nota = ( ( transa == 'N' ) || ( transa == 'n' ) );

  if ( nota )
  {
    nrowa = m;
//  ncola = k;
  }
  else
  {
    nrowa = k;
//  ncola = m;
  }

  notb = ( ( transb == 'N' ) || ( transb == 'n' ) );

  if ( notb )
  {
    nrowb = k;
  }
  else
  {
    nrowb = n;
  }
//
//  Test the input parameters.
//
//info = 0;

  if ( ! ( transa == 'N' || transa == 'n' ||
           transa == 'C' || transa == 'c' ||
           transa == 'T' || transa == 't' ) )
  {
    cerr << "\n";
    cerr << "DGEMM - Fatal error!\n";
    cerr << "  Input TRANSA has an illegal value.\n";
    exit ( 1 );
  }

  if ( ! ( transb == 'N' || transb == 'n' ||
           transb == 'C' || transb == 'c' ||
           transb == 'T' || transb == 't' ) )
  {
    cerr << "\n";
    cerr << "DGEMM - Fatal error!\n";
    cerr << "  Input TRANSB has an illegal value.\n";
    exit ( 1 );
  }

  if ( m < 0 )
  {
    cerr << "\n";
    cerr << "DGEMM - Fatal error!\n";
    cerr << "  Input M has an illegal value.\n";
    exit ( 1 );
  }

  if ( n < 0 )
  {
    cerr << "\n";
    cerr << "DGEMM - Fatal error!\n";
    cerr << "  Input N has an illegal value.\n";
    exit ( 1 );
  }

  if ( k  < 0 )
  {
    cerr << "\n";
    cerr << "DGEMM - Fatal error!\n";
    cerr << "  Input K has an illegal value.\n";
    exit ( 1 );
  }

  if ( lda < i4_max ( 1, nrowa ) )
  {
    cerr << "\n";
    cerr << "DGEMM - Fatal error!\n";
    cerr << "  Input LDA has an illegal value.\n";
    exit ( 1 );
  }

  if ( ldb < i4_max ( 1, nrowb ) )
  {
    cerr << "\n";
    cerr << "DGEMM - Fatal error!\n";
    cerr << "  Input LDB has an illegal value.\n";
    exit ( 1 );
  }

  if ( ldc < i4_max ( 1, m ) )
  {
    cerr << "\n";
    cerr << "DGEMM - Fatal error!\n";
    cerr << "  Input LDC has an illegal value.\n";
    exit ( 1 );
  }
//
//  Quick return if possible.
//
  if ( m == 0 )
  {
    return;
  }

  if ( n == 0 )
  {
    return;
  }

  if ( ( alpha == 0.0 || k == 0 ) && ( beta == 1.0 ) )
  {
    return;
  }
//
//  And if alpha is 0.0.
//
  if ( alpha == 0.0 )
  {
    if ( beta == 0.0 )
    {
      for ( j = 0; j < n; j++ )
      {
        for ( i = 0; i < m; i++ )
        {
          c[i+j*ldc] = 0.0;
        }
      }
    }
    else
    {
      for ( j = 0; j < n; j++ )
      {
        for ( i = 0; i < m; i++ )
        {
          c[i+j*ldc] = beta * c[i+j*ldc];
        }
      }
    }
    return;
  }
//
//  Start the operations.
//
  if ( notb )
  {
//
//  Form  C := alpha*A*B + beta*C.
//
    if ( nota )
    {
      for ( j = 0; j < n; j++ )
      {
        if ( beta == 0.0 )
        {
          for ( i = 0; i < m; i++ )
          {
            c[i+j*ldc] = 0.0;
          }
        }
        else if ( beta != 1.0 )
        {
          for ( i = 0; i < m; i++ )
          {
            c[i+j*ldc] = beta * c[i+j*ldc];
          }
        }

        for ( l = 0; l < k; l++ )
        {
          if ( b[l+j*ldb] != 0.0 )
          {
            temp = alpha * b[l+j*ldb];
            for ( i = 0; i < m; i++ )
            {
              c[i+j*ldc] = c[i+j*ldc] + temp * a[i+l*lda];
            }
          }
        }

      }
    }
//
//  Form  C := alpha*A'*B + beta*C
//
    else
    {
      for ( j = 0; j < n; j++ )
      {
        for ( i = 0; i < m; i++ )
        {
          temp = 0.0;
          for ( l = 0; l < k; l++ )
          {
            temp = temp + a[l+i*lda] * b[l+j*ldb];
          }

          if ( beta == 0.0 )
          {
            c[i+j*ldc] = alpha * temp;
          }
          else
          {
            c[i+j*ldc] = alpha * temp + beta * c[i+j*ldc];
          }
        }
      }
    }
  }
//
//  Form  C := alpha*A*B' + beta*C
//
  else
  {
    if ( nota )
    {
      for ( j = 0; j < n; j++ )
      {
        if ( beta == 0.0 )
        {
          for ( i = 0; i < m; i++ )
          {
            c[i+j*ldc] = 0.0;
          }
        }
        else if ( beta != 1.0 )
        {
          for ( i = 0; i < m; i++ )
          {
            c[i+j*ldc] = beta * c[i+j*ldc];
          }
        }

        for ( l = 0; l < k; l++ )
        {
          if ( b[j+l*ldb] != 0.0 )
          {
            temp = alpha * b[j+l*ldb];
            for ( i = 0; i < m; i++ )
            {
              c[i+j*ldc] = c[i+j*ldc] + temp * a[i+l*lda];
            }
          }
        }
      }
    }
//
//  Form  C := alpha*A'*B' + beta*C
//
    else
    {
      for ( j = 0; j < n; j++ )
      {
        for ( i = 0; i < m; i++ )
        {
          temp = 0.0;
          for ( l = 0; l < k; l++ )
          {
            temp = temp + a[l+i*lda] * b[j+l*ldb];
          }
          if ( beta == 0.0 )
          {
            c[i+j*ldc] = alpha * temp;
          }
          else
          {
            c[i+j*ldc] = alpha * temp + beta * c[i+j*ldc];
          }
        }
      }
    }
  }

  return;
}